

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall
binlog::PrettyPrinter::printEventField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,Event *event,WriterProp *writerProp)

{
  byte bVar1;
  Severity SVar2;
  pointer pcVar3;
  size_type sVar4;
  uint uVar5;
  undefined8 in_RAX;
  long lVar6;
  undefined7 in_register_00000011;
  void *__buf;
  int iVar7;
  uint64_t v;
  uint5 local_18;
  undefined3 uStack_13;
  
  iVar7 = (int)CONCAT71(in_register_00000011,spec);
  if (99 < iVar7) {
    switch(iVar7) {
    case 0x6d:
      printEventMessage(this,out,event);
      return;
    case 0x6e:
      iVar7 = (int)(writerProp->name)._M_dataplus._M_p;
      __buf = (void *)(writerProp->name)._M_string_length;
      goto LAB_001124ec;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      break;
    case 0x72:
      v = event->clockValue;
      goto LAB_001124bc;
    case 0x74:
      v = writerProp->id;
      goto LAB_001124bc;
    case 0x75:
      printUTCTime(this,out,event->clockValue);
      return;
    default:
      if (iVar7 == 100) {
        printProducerLocalTime(this,out,event->clockValue);
        return;
      }
    }
    goto switchD_00112344_caseD_44;
  }
  switch(iVar7) {
  case 0x43:
    iVar7 = (int)(event->source->category)._M_dataplus._M_p;
    __buf = (void *)(event->source->category)._M_string_length;
    break;
  case 0x46:
    iVar7 = (int)(event->source->file)._M_dataplus._M_p;
    __buf = (void *)(event->source->file)._M_string_length;
    break;
  case 0x47:
    pcVar3 = (event->source->file)._M_dataplus._M_p;
    sVar4 = (event->source->file)._M_string_length;
    lVar6 = sVar4 + 1;
    while (lVar6 != 1) {
      bVar1 = pcVar3[lVar6 + -2];
      event = (Event *)(ulong)bVar1;
      lVar6 = lVar6 + -1;
      if ((bVar1 == 0x5c) || (bVar1 == 0x2f)) goto LAB_001124e6;
    }
    lVar6 = 0;
LAB_001124e6:
    iVar7 = (int)pcVar3 + (int)lVar6;
    __buf = (void *)(sVar4 - lVar6);
    break;
  case 0x49:
    v = event->source->id;
    goto LAB_001124bc;
  case 0x4c:
    v = event->source->line;
LAB_001124bc:
    detail::OstreamBuffer::writeUnsigned(out,v);
    return;
  case 0x4d:
    iVar7 = (int)(event->source->function)._M_dataplus._M_p;
    __buf = (void *)(event->source->function)._M_string_length;
    break;
  case 0x50:
    iVar7 = (int)(event->source->formatString)._M_dataplus._M_p;
    __buf = (void *)(event->source->formatString)._M_string_length;
    break;
  case 0x53:
    SVar2 = event->source->severity;
    uVar5 = 0x574b4e55;
    if (SVar2 < warning) {
      if (SVar2 == trace) {
        uVar5 = 0x43415254;
      }
      else if (SVar2 == debug) {
        uVar5 = 0x47424544;
      }
      else if (SVar2 == info) {
        uVar5 = 0x4f464e49;
      }
    }
    else if (SVar2 < critical) {
      if (SVar2 == warning) {
        uVar5 = 0x4e524157;
      }
      else if (SVar2 == error) {
        uVar5 = 0x4f525245;
      }
    }
    else if (SVar2 == critical) {
      uVar5 = 0x54495243;
    }
    else if (SVar2 == no_logs) {
      uVar5 = 0x474c4f4e;
    }
    uStack_13 = (undefined3)((ulong)in_RAX >> 0x28);
    local_18 = (uint5)uVar5;
    detail::OstreamBuffer::write(out,(int)&local_18,(void *)0x4,(ulong)SVar2);
    return;
  case 0x54:
    iVar7 = (int)(event->source->argumentTags)._M_dataplus._M_p;
    __buf = (void *)(event->source->argumentTags)._M_string_length;
    break;
  default:
    if (iVar7 == 0x25) {
      spec = '%';
      goto LAB_001123be;
    }
  case 0x44:
  case 0x45:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x52:
switchD_00112344_caseD_44:
    detail::OstreamBuffer::put(out,'%');
LAB_001123be:
    detail::OstreamBuffer::put(out,spec);
    return;
  }
LAB_001124ec:
  detail::OstreamBuffer::write(out,iVar7,__buf,(size_t)event);
  return;
}

Assistant:

void PrettyPrinter::printEventField(
  detail::OstreamBuffer& out,
  char spec,
  const Event& event,
  const WriterProp& writerProp
) const
{
  switch (spec)
  {
  case 'I':
    out << event.source->id;
    break;
  case 'S':
    out << severityToString(event.source->severity);
    break;
  case 'C':
    out << event.source->category;
    break;
  case 'M':
    out << event.source->function;
    break;
  case 'F':
    out << event.source->file;
    break;
  case 'G':
    printFilename(out, event.source->file);
    break;
  case 'L':
    out << event.source->line;
    break;
  case 'P':
    out << event.source->formatString;
    break;
  case 'T':
    out << event.source->argumentTags;
    break;
  case 'n':
    out << writerProp.name;
    break;
  case 't':
    out << writerProp.id;
    break;
  case 'd':
    printProducerLocalTime(out, event.clockValue);
    break;
  case 'u':
    printUTCTime(out, event.clockValue);
    break;
  case 'r':
    out << event.clockValue;
    break;
  case 'm':
    printEventMessage(out, event);
    break;
  case '%':
    out.put('%');
    break;
  default:
    out << '%' << spec;
    break;
  }
}